

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

bool __thiscall
testing::internal::TypedExpectation<MockProblemBuilder_&()>::ShouldHandleArguments
          (TypedExpectation<MockProblemBuilder_&()> *this,ArgumentTuple *args)

{
  bool bVar1;
  undefined1 uVar2;
  DummyMatchResultListener dummy;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  ExpectationBase::CheckActionCountIfNotDone((ExpectationBase *)this);
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  if ((this[0x84] == (TypedExpectation<MockProblemBuilder_&()>)0x0) &&
     (bVar1 = ExpectationBase::AllPrerequisitesAreSatisfied((ExpectationBase *)this), bVar1)) {
    MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
    uVar2 = (**(code **)(**(long **)(this + 0x100) + 0x20))(*(long **)(this + 0x100),args);
    return (bool)uVar2;
  }
  return false;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    // In case the action count wasn't checked when the expectation
    // was defined (e.g. if this expectation has no WillRepeatedly()
    // or RetiresOnSaturation() clause), we check it when the
    // expectation is used for the first time.
    CheckActionCountIfNotDone();
    return !is_retired() && AllPrerequisitesAreSatisfied() && Matches(args);
  }